

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setMemSize(void)

{
  ostream *poVar1;
  int local_14;
  char *pcStack_10;
  int size;
  char *p;
  
  local_14 = 0x800;
  pcStack_10 = strtok((char *)0x0,"");
  if (pcStack_10 == (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"have no enough args");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    __isoc99_sscanf(pcStack_10,"%d",&local_14);
    reset(local_14);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "mem size changed. all of mem and process info have been reset.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void setMemSize() {
    // 获取参数
    char *p;
    int size = DEFAULT_MEM_SIZE;
    p = strtok(NULL, "");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &size);

    // 重置
    reset(size);

    cout << "mem size changed. all of mem and process info have been reset." << endl;
}